

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_large_dalloc_stats_update(tsdn_t *tsdn,arena_t *arena,size_t usize)

{
  long *plVar1;
  locked_u64_t *plVar2;
  uint uVar3;
  ulong uVar4;
  
  if (usize < 0x1001) {
    uVar3 = (uint)duckdb_je_sz_size2index_tab[usize + 7 >> 3];
  }
  else {
    uVar3 = sz_size2index_compute(usize);
    if (0x3fff < usize) {
      LOCK();
      plVar2 = &(arena->stats).lstats[uVar3 - 0x24].ndalloc;
      (plVar2->val).repr = (plVar2->val).repr + 1;
      UNLOCK();
      return;
    }
  }
  uVar4 = (ulong)duckdb_je_arena_bin_offsets[uVar3];
  malloc_mutex_lock(tsdn,(malloc_mutex_t *)((long)&arena->nthreads[0].repr + uVar4));
  plVar1 = (long *)((long)(arena->stats).mutex_prof_data + (uVar4 - 0x68));
  *plVar1 = *plVar1 + 1;
  *(undefined1 *)((long)(arena->nthreads + 0x10) + uVar4) = 0;
  pthread_mutex_unlock
            ((pthread_mutex_t *)((long)&((atomic_zu_t *)(arena->nthreads + 0x12))->repr + uVar4));
  return;
}

Assistant:

static void
arena_large_dalloc_stats_update(tsdn_t *tsdn, arena_t *arena, size_t usize) {
	cassert(config_stats);

	szind_t index = sz_size2index(usize);
	/* This only occurs when we have a sampled small allocation */
	if (usize < SC_LARGE_MINCLASS) {
		assert(index < SC_NBINS);
		assert(usize >= PAGE && usize % PAGE == 0);
		bin_t *bin = arena_get_bin(arena, index, /* binshard */ 0);
		malloc_mutex_lock(tsdn, &bin->lock);
		bin->stats.ndalloc++;
		malloc_mutex_unlock(tsdn, &bin->lock);
	} else {
		assert(index >= SC_NBINS);
		szind_t hindex = index - SC_NBINS;
		LOCKEDINT_MTX_LOCK(tsdn, arena->stats.mtx);
		locked_inc_u64(tsdn, LOCKEDINT_MTX(arena->stats.mtx),
			&arena->stats.lstats[hindex].ndalloc, 1);
		LOCKEDINT_MTX_UNLOCK(tsdn, arena->stats.mtx);
	}
}